

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall tetgenio::load_ply(tetgenio *this,char *filebasename)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  size_t sVar5;
  FILE *__stream;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  facet *pfVar9;
  polygon *ppVar10;
  int *piVar11;
  double dVar12;
  uint local_c74;
  int local_c70;
  int smallestidx;
  int i;
  int line_count;
  int ifaces;
  int nfaces;
  int iverts;
  int nverts;
  int format;
  int endheader;
  double *coord;
  char *str;
  char *bufferp;
  char buffer [2048];
  char infilename [1024];
  polygon *p;
  facet *f;
  FILE *fp;
  char *filebasename_local;
  tetgenio *this_local;
  
  nverts = 0;
  iverts = 0;
  nfaces = 0;
  ifaces = 0;
  line_count = 0;
  i = 0;
  smallestidx = 0;
  local_c74 = 0;
  strncpy(buffer + 0x7f8,filebasename,0x3ff);
  if (buffer[0x7f8] == '\0') {
    printf("Error:  No filename.\n");
  }
  else {
    sVar5 = strlen(buffer + 0x7f8);
    iVar4 = strcmp(buffer + sVar5 + 0x7f4,".ply");
    if (iVar4 != 0) {
      strcat(buffer + 0x7f8,".ply");
    }
    __stream = fopen(buffer + 0x7f8,"r");
    if (__stream == (FILE *)0x0) {
      printf("Error:  Unable to open file %s\n",buffer + 0x7f8);
    }
    else {
      printf("Opening %s.\n",buffer + 0x7f8);
LAB_0010e908:
      do {
        str = readline(this,(char *)&bufferp,(FILE *)__stream,&smallestidx);
        if (str == (char *)0x0) {
LAB_0010f10c:
          fclose(__stream);
          if (local_c74 == 0) {
            this->firstnumber = 0;
          }
          else {
            if (local_c74 != 1) {
              printf("A wrong smallest index (%d) was detected in file %s\n",(ulong)local_c74,
                     buffer + 0x7f8);
              return false;
            }
            this->firstnumber = 1;
          }
          if (ifaces != nfaces) {
            printf("Expected %d vertices, but read only %d vertices in file %s\n",
                   (ulong)(uint)nfaces,(ulong)(uint)ifaces,buffer + 0x7f8);
            return false;
          }
          if (i != line_count) {
            printf("Expected %d faces, but read only %d faces in file %s\n",(ulong)(uint)line_count,
                   (ulong)(uint)i,buffer + 0x7f8);
            return false;
          }
          return true;
        }
        if (nverts != 0) {
          if (ifaces < nfaces) {
            _format = this->pointlist + ifaces * 3;
            for (local_c70 = 0; local_c70 < 3; local_c70 = local_c70 + 1) {
              if (*str == '\0') {
                printf("Syntax error reading vertex coords on line %d in file %s\n",
                       (ulong)(uint)smallestidx,buffer + 0x7f8);
                fclose(__stream);
                return false;
              }
              dVar12 = strtod(str,&str);
              _format[local_c70] = dVar12;
              str = findnextnumber(this,str);
            }
            ifaces = ifaces + 1;
          }
          else {
            if (line_count <= i) {
              printf("Found extra text starting at line %d in file %s\n",(ulong)(uint)smallestidx,
                     buffer + 0x7f8);
              goto LAB_0010f10c;
            }
            pfVar9 = this->facetlist + i;
            init((EVP_PKEY_CTX *)pfVar9);
            pfVar9->numberofpolygons = 1;
            ppVar10 = (polygon *)operator_new__(0x10);
            pfVar9->polygonlist = ppVar10;
            ppVar10 = pfVar9->polygonlist;
            init((EVP_PKEY_CTX *)ppVar10);
            lVar6 = strtol(str,&str,0);
            ppVar10->numberofvertices = (int)lVar6;
            if (ppVar10->numberofvertices == 0) {
              printf("Syntax error reading polygon on line %d in file %s\n",(ulong)(uint)smallestidx
                     ,buffer + 0x7f8);
              fclose(__stream);
              return false;
            }
            auVar3._8_8_ = 0;
            auVar3._0_8_ = (long)ppVar10->numberofvertices;
            uVar7 = SUB168(auVar3 * ZEXT816(4),0);
            if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
              uVar7 = 0xffffffffffffffff;
            }
            piVar11 = (int *)operator_new__(uVar7);
            ppVar10->vertexlist = piVar11;
            for (local_c70 = 0; local_c70 < ppVar10->numberofvertices; local_c70 = local_c70 + 1) {
              str = findnextnumber(this,str);
              if (*str == '\0') {
                printf("Syntax error reading polygon on line %d in file %s\n",
                       (ulong)(uint)smallestidx,buffer + 0x7f8);
                fclose(__stream);
                return false;
              }
              lVar6 = strtol(str,&str,0);
              ppVar10->vertexlist[local_c70] = (int)lVar6;
              if (ppVar10->vertexlist[local_c70] < (int)local_c74) {
                local_c74 = ppVar10->vertexlist[local_c70];
              }
            }
            i = i + 1;
          }
          goto LAB_0010e908;
        }
        coord = (double *)strstr(str,"end_header");
        if (coord == (double *)0x0) {
          coord = (double *)strstr(str,"End_header");
        }
        if (coord == (double *)0x0) {
          coord = (double *)strstr(str,"End_Header");
        }
        if (coord != (double *)0x0) {
          nverts = 1;
          goto LAB_0010e908;
        }
        if ((nfaces == 0) || (line_count == 0)) {
          coord = (double *)strstr(str,"element");
          if (coord == (double *)0x0) {
            coord = (double *)strstr(str,"Element");
          }
          if (coord != (double *)0x0) {
            str = findnextfield(this,(char *)coord);
            if (*str == '\0') {
              printf("Syntax error reading element type on line%d in file %s\n",
                     (ulong)(uint)smallestidx,buffer + 0x7f8);
              fclose(__stream);
              return false;
            }
            if (nfaces == 0) {
              coord = (double *)strstr(str,"vertex");
              if (coord == (double *)0x0) {
                coord = (double *)strstr(str,"Vertex");
              }
              if (coord != (double *)0x0) {
                str = findnextnumber(this,(char *)coord);
                if (*str == '\0') {
                  printf("Syntax error reading vertex number on line");
                  printf(" %d in file %s\n",(ulong)(uint)smallestidx,buffer + 0x7f8);
                  fclose(__stream);
                  return false;
                }
                lVar6 = strtol(str,&str,0);
                nfaces = (int)lVar6;
                if (0 < nfaces) {
                  this->numberofpoints = nfaces;
                  auVar1._8_8_ = 0;
                  auVar1._0_8_ = (long)(nfaces * 3);
                  uVar7 = SUB168(auVar1 * ZEXT816(8),0);
                  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
                    uVar7 = 0xffffffffffffffff;
                  }
                  pdVar8 = (double *)operator_new__(uVar7);
                  this->pointlist = pdVar8;
                  local_c74 = nfaces + 1;
                }
              }
            }
            if (line_count == 0) {
              coord = (double *)strstr(str,"face");
              if (coord == (double *)0x0) {
                coord = (double *)strstr(str,"Face");
              }
              if (coord != (double *)0x0) {
                str = findnextnumber(this,(char *)coord);
                if (*str == '\0') {
                  printf("Syntax error reading face number on line");
                  printf(" %d in file %s\n",(ulong)(uint)smallestidx,buffer + 0x7f8);
                  fclose(__stream);
                  return false;
                }
                lVar6 = strtol(str,&str,0);
                line_count = (int)lVar6;
                if (0 < line_count) {
                  this->numberoffacets = line_count;
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = (long)line_count;
                  uVar7 = SUB168(auVar2 * ZEXT816(0x20),0);
                  if (SUB168(auVar2 * ZEXT816(0x20),8) != 0) {
                    uVar7 = 0xffffffffffffffff;
                  }
                  pfVar9 = (facet *)operator_new__(uVar7);
                  this->facetlist = pfVar9;
                }
              }
            }
          }
        }
        if (iverts != 0) goto LAB_0010e908;
        coord = (double *)strstr(str,"format");
        if (coord == (double *)0x0) {
          coord = (double *)strstr(str,"Format");
        }
        if (coord == (double *)0x0) goto LAB_0010e908;
        iverts = 1;
        str = findnextfield(this,(char *)coord);
        coord = (double *)strstr(str,"ascii");
        if (coord == (double *)0x0) {
          coord = (double *)strstr(str,"ASCII");
        }
      } while (coord != (double *)0x0);
      printf("This routine only reads ascii format of ply files.\n");
      printf("Hint: You can convert the binary to ascii format by\n");
      printf("  using the provided ply tools:\n");
      printf("  ply2ascii < %s > ascii_%s\n",buffer + 0x7f8,buffer + 0x7f8);
      fclose(__stream);
    }
  }
  return false;
}

Assistant:

bool tetgenio::load_ply(char* filebasename)
{
  FILE *fp;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char buffer[INPUTLINESIZE];
  char *bufferp, *str;
  double *coord;
  int endheader = 0, format = 0;
  int nverts = 0, iverts = 0;
  int nfaces = 0, ifaces = 0;
  int line_count = 0, i;

  // Default, the ply file's index is from '0'. We check it by remembering the
  //   smallest index we found in the file. It should be either 0 or 1.
  int smallestidx = 0; 

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 4], ".ply") != 0) {
    strcat(infilename, ".ply");
  }

  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  while ((bufferp = readline(buffer, fp, &line_count)) != NULL) {
    if (!endheader) {
      // Find if it is the keyword "end_header".
      str = strstr(bufferp, "end_header");
      // strstr() is case sensitive.
      if (!str) str = strstr(bufferp, "End_header");
      if (!str) str = strstr(bufferp, "End_Header");
      if (str) {
        // This is the end of the header section.
        endheader = 1; 
        continue;
      }
      // Parse the number of vertices and the number of faces.
      if (nverts == 0 || nfaces == 0) {
        // Find if it si the keyword "element".
        str = strstr(bufferp, "element");
        if (!str) str = strstr(bufferp, "Element");
        if (str) {
          bufferp = findnextfield(str);
          if (*bufferp == '\0') {
            printf("Syntax error reading element type on line%d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          if (nverts == 0) {
            // Find if it is the keyword "vertex".
            str = strstr(bufferp, "vertex");
            if (!str) str = strstr(bufferp, "Vertex");
            if (str) {
              bufferp = findnextnumber(str);
              if (*bufferp == '\0') {
                printf("Syntax error reading vertex number on line");
                printf(" %d in file %s\n", line_count, infilename);
                fclose(fp);
                return false;
              }
              nverts = (int) strtol(bufferp, &bufferp, 0);
              // Allocate memory for 'tetgenio'
              if (nverts > 0) {
                numberofpoints = nverts;
                pointlist = new REAL[nverts * 3];
                smallestidx = nverts + 1; // A big enough index.
              }
            }
          }
          if (nfaces == 0) {
            // Find if it is the keyword "face".
            str = strstr(bufferp, "face");
            if (!str) str = strstr(bufferp, "Face");
            if (str) {
              bufferp = findnextnumber(str);
              if (*bufferp == '\0') {
                printf("Syntax error reading face number on line");
                printf(" %d in file %s\n", line_count, infilename);
                fclose(fp);
                return false;
              }
              nfaces = (int) strtol(bufferp, &bufferp, 0);
              // Allocate memory for 'tetgenio'
              if (nfaces > 0) {        
                numberoffacets = nfaces;
                facetlist = new tetgenio::facet[nfaces];
              }
            }
          }
        } // It is not the string "element". 
      }
      if (format == 0) {
        // Find the keyword "format".
        str = strstr(bufferp, "format");
        if (!str) str = strstr(bufferp, "Format");
        if (str) {
          format = 1;
          bufferp = findnextfield(str);
          // Find if it is the string "ascii".
          str = strstr(bufferp, "ascii");
          if (!str) str = strstr(bufferp, "ASCII");
          if (!str) {
            printf("This routine only reads ascii format of ply files.\n");
            printf("Hint: You can convert the binary to ascii format by\n");
            printf("  using the provided ply tools:\n");
            printf("  ply2ascii < %s > ascii_%s\n", infilename, infilename);
            fclose(fp);
            return false;
          }
        }
      }
    } else if (iverts < nverts) {
      // Read vertex coordinates
      coord = &pointlist[iverts * 3];
      for (i = 0; i < 3; i++) {
        if (*bufferp == '\0') {
          printf("Syntax error reading vertex coords on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        coord[i] = (REAL) strtod(bufferp, &bufferp);
        bufferp = findnextnumber(bufferp);
      }
      iverts++;
    } else if (ifaces < nfaces) {
      // Get next face
      f = &facetlist[ifaces];
      init(f);      
      // In .off format, each facet has one polygon, no hole.
      f->numberofpolygons = 1;
      f->polygonlist = new tetgenio::polygon[1];
      p = &f->polygonlist[0];
      init(p);
      // Read the number of vertices, it should be greater than 0.
      p->numberofvertices = (int) strtol(bufferp, &bufferp, 0);
      if (p->numberofvertices == 0) {
        printf("Syntax error reading polygon on line %d in file %s\n",
               line_count, infilename);
        fclose(fp);
        return false;
      }
      // Allocate memory for face vertices
      p->vertexlist = new int[p->numberofvertices];
      for (i = 0; i < p->numberofvertices; i++) {
        bufferp = findnextnumber(bufferp);
        if (*bufferp == '\0') {
          printf("Syntax error reading polygon on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        p->vertexlist[i] = (int) strtol(bufferp, &bufferp, 0);
        if (p->vertexlist[i] < smallestidx) {
          smallestidx = p->vertexlist[i];
        }
      }
      ifaces++;
    } else {
      // Should never get here
      printf("Found extra text starting at line %d in file %s\n", line_count,
             infilename);
      break;
    }
  }

  // Close file
  fclose(fp);

  // Decide the firstnumber of the index.
  if (smallestidx == 0) {
    firstnumber = 0;  
  } else if (smallestidx == 1) {
    firstnumber = 1;
  } else {
    printf("A wrong smallest index (%d) was detected in file %s\n",
           smallestidx, infilename);
    return false;
  }

  if (iverts != nverts) {
    printf("Expected %d vertices, but read only %d vertices in file %s\n",
           nverts, iverts, infilename);
    return false;
  }
  if (ifaces != nfaces) {
    printf("Expected %d faces, but read only %d faces in file %s\n",
           nfaces, ifaces, infilename);
    return false;
  }

  return true;
}